

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

uint __thiscall
xercesc_4_0::ElemStack::mapPrefixToURI(ElemStack *this,XMLCh *prefixToMap,bool *unknown)

{
  StackElem *pSVar1;
  uint local_5c;
  ulong local_50;
  XMLSize_t mapIndex_1;
  XMLSize_t mapIndex;
  StackElem *curRow;
  XMLSize_t index;
  uint prefixId;
  bool *unknown_local;
  XMLCh *prefixToMap_local;
  ElemStack *this_local;
  
  *unknown = false;
  if ((prefixToMap == (XMLCh *)0x0) || (*prefixToMap == L'\0')) {
    local_5c = this->fGlobalPoolId;
  }
  else {
    local_5c = XMLStringPool::getId(&this->fPrefixPool,prefixToMap);
  }
  if (local_5c == 0) {
    *unknown = true;
    this_local._4_4_ = this->fUnknownNamespaceId;
  }
  else if (local_5c == this->fXMLPoolId) {
    this_local._4_4_ = this->fXMLNamespaceId;
  }
  else if (local_5c == this->fXMLNSPoolId) {
    this_local._4_4_ = this->fXMLNSNamespaceId;
  }
  else {
    for (curRow = (StackElem *)this->fStackTop; curRow != (StackElem *)0x0;
        curRow = (StackElem *)&curRow[-1].field_0x6f) {
      pSVar1 = this->fStack[(long)&curRow[-1].field_0x6f];
      for (mapIndex_1 = 0; mapIndex_1 < pSVar1->fMapCount; mapIndex_1 = mapIndex_1 + 1) {
        if (pSVar1->fMap[mapIndex_1].fPrefId == local_5c) {
          return pSVar1->fMap[mapIndex_1].fURIId;
        }
      }
    }
    if (this->fGlobalNamespaces != (StackElem *)0x0) {
      for (local_50 = 0; local_50 < this->fGlobalNamespaces->fMapCount; local_50 = local_50 + 1) {
        if (this->fGlobalNamespaces->fMap[local_50].fPrefId == local_5c) {
          return this->fGlobalNamespaces->fMap[local_50].fURIId;
        }
      }
    }
    if (*prefixToMap == L'\0') {
      this_local._4_4_ = this->fEmptyNamespaceId;
    }
    else {
      *unknown = true;
      this_local._4_4_ = this->fUnknownNamespaceId;
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ElemStack::mapPrefixToURI( const   XMLCh* const    prefixToMap
                                        ,       bool&           unknown) const
{
    // Assume we find it
    unknown = false;

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = (!prefixToMap || !*prefixToMap)?fGlobalPoolId : fPrefixPool.getId(prefixToMap);
    if (prefixId == 0)
    {
        unknown = true;
        return fUnknownNamespaceId;
    }
    //
    //  Check for the special prefixes 'xml' and 'xmlns' since they cannot
    //  be overridden.
    //
    else if (prefixId == fXMLPoolId)
        return fXMLNamespaceId;
    else if (prefixId == fXMLNSPoolId)
        return fXMLNSNamespaceId;

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    for (XMLSize_t index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // Search the map at this level for the passed prefix
        for (XMLSize_t mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
        {
            if (curRow->fMap[mapIndex].fPrefId == prefixId)
                return curRow->fMap[mapIndex].fURIId;
        }
    }
    //  If the prefix wasn't found, try in the global namespaces
    if(fGlobalNamespaces)
    {
        for (XMLSize_t mapIndex = 0; mapIndex < fGlobalNamespaces->fMapCount; mapIndex++)
        {
            if (fGlobalNamespaces->fMap[mapIndex].fPrefId == prefixId)
                return fGlobalNamespaces->fMap[mapIndex].fURIId;
        }
    }

    //
    //  If the prefix is an empty string, then we will return the special
    //  global namespace id. This can be overridden, but no one has or we
    //  would have not gotten here.
    //
    if (!*prefixToMap)
        return fEmptyNamespaceId;

    // Oh well, don't have a clue so return the unknown id
    unknown = true;
    return fUnknownNamespaceId;
}